

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ExpressionTimingCheckArgSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ExpressionTimingCheckArgSyntax,slang::syntax::ExpressionSyntax&,slang::syntax::TimingCheckConditionSyntax*&>
          (BumpAllocator *this,ExpressionSyntax *args,TimingCheckConditionSyntax **args_1)

{
  TimingCheckConditionSyntax *pTVar1;
  ExpressionTimingCheckArgSyntax *pEVar2;
  
  pEVar2 = (ExpressionTimingCheckArgSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8)
  ;
  if ((ExpressionTimingCheckArgSyntax *)this->endPtr < pEVar2 + 1) {
    pEVar2 = (ExpressionTimingCheckArgSyntax *)allocateSlow(this,0x20,8);
  }
  else {
    this->head->current = (byte *)(pEVar2 + 1);
  }
  pTVar1 = *args_1;
  (pEVar2->super_TimingCheckArgSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pEVar2->super_TimingCheckArgSyntax).super_SyntaxNode.kind = ExpressionTimingCheckArg;
  (pEVar2->expr).ptr = args;
  pEVar2->condition = pTVar1;
  (args->super_SyntaxNode).parent = (SyntaxNode *)pEVar2;
  if (pTVar1 != (TimingCheckConditionSyntax *)0x0) {
    (pTVar1->super_SyntaxNode).parent = (SyntaxNode *)pEVar2;
  }
  return pEVar2;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }